

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O0

VmConstant *
LoadFrameValue(InstructionVMEvalContext *ctx,VmConstant *pointer,VmConstant *offset,VmType type,
              uint loadSize)

{
  SynIdentifier *pSVar1;
  VmType type_00;
  VmType type_01;
  VmType type_02;
  bool bVar2;
  uint local_5c;
  undefined1 auStack_58 [4];
  uint location;
  InplaceStr functionName;
  Storage *target;
  uint base;
  uint loadSize_local;
  VmConstant *offset_local;
  VmConstant *pointer_local;
  InstructionVMEvalContext *ctx_local;
  VmType type_local;
  
  type_local._0_8_ = type.structType;
  ctx_local = type._0_8_;
  target._0_4_ = 0;
  target._4_4_ = loadSize;
  _base = offset;
  offset_local = pointer;
  pointer_local = (VmConstant *)ctx;
  functionName.end = (char *)FindTarget(ctx,pointer,(uint *)&target);
  if ((Storage *)functionName.end == (Storage *)0x0) {
    if (((pointer_local->super_VmValue).type.size & 1) == 0) {
      __assert_fail("ctx.hasError",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                    ,0x23f,
                    "VmConstant *LoadFrameValue(InstructionVMEvalContext &, VmConstant *, VmConstant *, VmType, unsigned int)"
                   );
    }
    type_local.structType = (TypeBase *)0x0;
  }
  else {
    if ((*(byte *)((long)pointer_local[3].super_VmValue.users.little + 0x39) & 1) != 0) {
      if ((((Storage *)functionName.end)->functionOwner == (VmFunction *)0x0) ||
         (((Storage *)functionName.end)->functionOwner->function == (FunctionData *)0x0)) {
        InplaceStr::InplaceStr((InplaceStr *)auStack_58,"---");
      }
      else {
        pSVar1 = ((Storage *)functionName.end)->functionOwner->function->name;
        _auStack_58 = (pSVar1->name).begin;
        functionName.begin = (pSVar1->name).end;
      }
      printf("      LoadFrameValue %.*s [%s] @ %04x + %02x [%02x]\n",
             (ulong)(uint)((int)functionName.begin - (int)_auStack_58),_auStack_58,
             *(undefined8 *)(functionName.end + 8),(ulong)(uint)target,
             (ulong)(offset_local->iValue & 0xffff),target._4_4_);
    }
    local_5c = (offset_local->iValue & 0xffffU) + (uint)target;
    if (_base != (VmConstant *)0x0) {
      local_5c = _base->iValue + local_5c;
    }
    bVar2 = VmType::operator==((VmType *)&ctx_local,&VmType::Int);
    if ((bVar2) && (target._4_4_ == 1)) {
      type_local.structType =
           (TypeBase *)
           LoadFrameByte((InstructionVMEvalContext *)pointer_local,(Storage *)functionName.end,
                         local_5c);
    }
    else {
      bVar2 = VmType::operator==((VmType *)&ctx_local,&VmType::Int);
      if ((bVar2) && (target._4_4_ == 2)) {
        type_local.structType =
             (TypeBase *)
             LoadFrameShort((InstructionVMEvalContext *)pointer_local,(Storage *)functionName.end,
                            local_5c);
      }
      else {
        bVar2 = VmType::operator==((VmType *)&ctx_local,&VmType::Int);
        if (((bVar2) || ((int)ctx_local == 6)) && (target._4_4_ == 4)) {
          type_02.structType = (TypeBase *)type_local._0_8_;
          type_02._0_8_ = ctx_local;
          type_local.structType =
               (TypeBase *)
               LoadFrameInt((InstructionVMEvalContext *)pointer_local,(Storage *)functionName.end,
                            local_5c,type_02);
        }
        else {
          bVar2 = VmType::operator==((VmType *)&ctx_local,&VmType::Double);
          if ((bVar2) && (target._4_4_ == 4)) {
            type_local.structType =
                 (TypeBase *)
                 LoadFrameFloat((InstructionVMEvalContext *)pointer_local,
                                (Storage *)functionName.end,local_5c);
          }
          else {
            bVar2 = VmType::operator==((VmType *)&ctx_local,&VmType::Double);
            if ((bVar2) && (target._4_4_ == 8)) {
              type_local.structType =
                   (TypeBase *)
                   LoadFrameDouble((InstructionVMEvalContext *)pointer_local,
                                   (Storage *)functionName.end,local_5c);
            }
            else {
              bVar2 = VmType::operator==((VmType *)&ctx_local,&VmType::Long);
              if (((bVar2) || ((int)ctx_local == 6)) && (target._4_4_ == 8)) {
                type_01.structType = (TypeBase *)type_local._0_8_;
                type_01._0_8_ = ctx_local;
                type_local.structType =
                     (TypeBase *)
                     LoadFrameLong((InstructionVMEvalContext *)pointer_local,
                                   (Storage *)functionName.end,local_5c,type_01);
              }
              else {
                type_00.structType = (TypeBase *)type_local._0_8_;
                type_00._0_8_ = ctx_local;
                type_local.structType =
                     (TypeBase *)
                     LoadFrameStruct((InstructionVMEvalContext *)pointer_local,
                                     (Storage *)functionName.end,local_5c,type_00);
              }
            }
          }
        }
      }
    }
  }
  return (VmConstant *)type_local.structType;
}

Assistant:

VmConstant* LoadFrameValue(InstructionVMEvalContext &ctx, VmConstant *pointer, VmConstant *offset, VmType type, unsigned loadSize)
{
	unsigned base = 0;

	if(InstructionVMEvalContext::Storage *target = FindTarget(ctx, pointer, base))
	{
		if(ctx.printExecution)
		{
			InplaceStr functionName = target->functionOwner && target->functionOwner->function? target->functionOwner->function->name->name : InplaceStr("---");

			printf("      LoadFrameValue %.*s [%s] @ %04x + %02x [%02x]\n", FMT_ISTR(functionName), target->tag, base, pointer->iValue & memoryOffsetMask, loadSize);
		}

		unsigned location = (pointer->iValue & memoryOffsetMask) + base;

		if(offset)
			location += offset->iValue;

		if(type == VmType::Int && loadSize == 1)
			return LoadFrameByte(ctx, target, location);

		if(type == VmType::Int && loadSize == 2)
			return LoadFrameShort(ctx, target, location);

		if((type == VmType::Int || type.type == VM_TYPE_POINTER) && loadSize == 4)
			return LoadFrameInt(ctx, target, location, type);

		if(type == VmType::Double && loadSize == 4)
			return LoadFrameFloat(ctx, target, location);

		if(type == VmType::Double && loadSize == 8)
			return LoadFrameDouble(ctx, target, location);

		if((type == VmType::Long || type.type == VM_TYPE_POINTER) && loadSize == 8)
			return LoadFrameLong(ctx, target, location, type);

		return LoadFrameStruct(ctx, target, location, type);
	}

	assert(ctx.hasError);

	return NULL;
}